

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uts2-lace.c
# Opt level: O0

int main(int argc,char **argv)

{
  double dVar1;
  undefined1 local_60 [8];
  Result r;
  double t2;
  double t1;
  Node root;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  root.state.state._12_8_ = argv;
  argv_local._0_4_ = argc;
  lace_parseParams((int *)&argv_local,argv);
  uts_parseParams((int)argv_local,(char **)root.state.state._12_8_);
  uts_printParams();
  uts_initRoot((Node *)&t1,type);
  lace_start(_lace_workers,(long)_lace_dqsize);
  printf("Initialized Lace with %d workers, dqsize=%d\n",(ulong)(uint)_lace_workers,
         (ulong)(uint)_lace_dqsize);
  dVar1 = uts_wctime();
  parTreeSearch_RUN((Result *)local_60,0,(Node *)&t1);
  r.leaves = (counter_t)uts_wctime();
  maxTreeDepth = (counter_t)local_60;
  nNodes = r.maxdepth;
  nLeaves = r.size;
  uts_showStats(1,0,(double)r.leaves - dVar1,r.maxdepth,r.size,(counter_t)local_60);
  printf("Time: %f\n",(double)r.leaves - dVar1);
  lace_stop();
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  Node root;
  double t1, t2;

  lace_parseParams(&argc, argv);
  uts_parseParams(argc, argv);

  uts_printParams();
  uts_initRoot(&root, type);
  
  lace_start(_lace_workers, _lace_dqsize);

  printf("Initialized Lace with %d workers, dqsize=%d\n", _lace_workers, _lace_dqsize);

  t1 = uts_wctime();
  Result r = RUN(parTreeSearch, 0, &root);
  t2 = uts_wctime();

  maxTreeDepth = r.maxdepth;
  nNodes  = r.size;
  nLeaves = r.leaves;

  uts_showStats(GET_NUM_THREADS, 0, t2-t1, nNodes, nLeaves, maxTreeDepth);

  printf("Time: %f\n", t2-t1);

  lace_stop();

  return 0;
}